

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O0

void __thiscall
OpenMPDeclareMapperDirective::OpenMPDeclareMapperDirective
          (OpenMPDeclareMapperDirective *this,OpenMPDeclareMapperDirectiveIdentifier _identifier)

{
  OpenMPDeclareMapperDirectiveIdentifier _identifier_local;
  OpenMPDeclareMapperDirective *this_local;
  
  OpenMPDirective::OpenMPDirective
            (&this->super_OpenMPDirective,OMPD_declare_mapper,Lang_unknown,0,0);
  this->identifier = OMPD_DECLARE_MAPPER_IDENTIFIER_unspecified;
  std::__cxx11::string::string((string *)&this->user_defined_identifier);
  std::__cxx11::string::string((string *)&this->type_var);
  std::__cxx11::string::string((string *)&this->type);
  std::__cxx11::string::string((string *)&this->var);
  this->identifier = _identifier;
  return;
}

Assistant:

OpenMPDeclareMapperDirective(OpenMPDeclareMapperDirectiveIdentifier _identifier) :
            OpenMPDirective(OMPD_declare_mapper){ identifier = _identifier;}